

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O1

void __thiscall duckdb_fmt::v6::internal::bigint::subtract_aligned(bigint *this,bigint *other)

{
  uint *puVar1;
  uint *puVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  
  uVar6 = (ulong)(uint)(other->bigits_).super_buffer<unsigned_int>.size_;
  iVar3 = other->exp_ - this->exp_;
  if (uVar6 == 0) {
    uVar4 = 0;
  }
  else {
    puVar1 = (other->bigits_).super_buffer<unsigned_int>.ptr_;
    puVar2 = (this->bigits_).super_buffer<unsigned_int>.ptr_;
    uVar5 = 0;
    lVar7 = 0;
    do {
      uVar4 = (ulong)puVar2[(long)iVar3 + uVar5] + (lVar7 - (ulong)puVar1[uVar5]);
      puVar2[(long)iVar3 + uVar5] = (uint)uVar4;
      lVar7 = (long)uVar4 >> 0x3f;
      uVar5 = uVar5 + 1;
    } while (uVar6 != uVar5);
    uVar4 = uVar4 >> 0x3f;
    iVar3 = iVar3 + (int)uVar5;
  }
  if ((int)uVar4 != 0) {
    puVar1 = (this->bigits_).super_buffer<unsigned_int>.ptr_;
    uVar6 = (ulong)puVar1[iVar3];
    do {
      uVar6 = (uVar6 & 0xffffffff) - uVar4;
      uVar4 = uVar6 >> 0x3f;
    } while ((long)uVar6 < 0);
    puVar1[iVar3] = (uint)uVar6;
    remove_leading_zeros(this);
    return;
  }
  remove_leading_zeros(this);
  return;
}

Assistant:

std::size_t size() const FMT_NOEXCEPT { return size_; }